

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_8::DiskHandle::WritableFileMappingImpl::sync(WritableFileMappingImpl *this)

{
  bool bVar1;
  int osErrorNumber;
  uchar *puVar2;
  uchar *puVar3;
  size_t size;
  void *pvVar4;
  Fault local_60;
  Fault f_1;
  SyscallResult local_4c;
  undefined1 auStack_48 [4];
  SyscallResult _kjSyscallResult;
  MmapRange range;
  Fault local_28;
  Fault f;
  WritableFileMappingImpl *this_local;
  ArrayPtr<unsigned_char> slice_local;
  
  f.exception = (Exception *)this;
  puVar2 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  puVar3 = Array<unsigned_char>::begin(&this->bytes);
  bVar1 = false;
  if (puVar3 <= puVar2) {
    puVar2 = ArrayPtr<unsigned_char>::end((ArrayPtr<unsigned_char> *)&this_local);
    puVar3 = Array<unsigned_char>::end(&this->bytes);
    bVar1 = puVar2 <= puVar3;
  }
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x1d1,FAILED,"slice.begin() >= bytes.begin() && slice.end() <= bytes.end()",
               "\"byte range is not part of this mapping\"",
               (char (*) [39])"byte range is not part of this mapping");
    _::Debug::Fault::fatal(&local_28);
  }
  puVar2 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  size = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  _auStack_48 = getMmapRange((uint64_t)puVar2,size);
  f_1.exception = (Exception *)auStack_48;
  local_4c = _::Debug::
             syscall<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl::sync(kj::ArrayPtr<unsigned_char>)const::_lambda()_1_>
                       ((anon_class_8_1_a88e285d *)&f_1,false);
  pvVar4 = _::Debug::SyscallResult::operator_cast_to_void_(&local_4c);
  if (pvVar4 != (void *)0x0) {
    return;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_4c);
  _::Debug::Fault::Fault
            (&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x1d5,osErrorNumber,
             "msync(reinterpret_cast<void*>(range.offset), range.size, MS_SYNC)","");
  _::Debug::Fault::fatal(&local_60);
}

Assistant:

void sync(ArrayPtr<byte> slice) const override {
      KJ_REQUIRE(slice.begin() >= bytes.begin() && slice.end() <= bytes.end(),
                 "byte range is not part of this mapping");

      // msync() requires page-alignment, apparently, so use getMmapRange() to accomplish that.
      auto range = getMmapRange(reinterpret_cast<uintptr_t>(slice.begin()), slice.size());
      KJ_SYSCALL(msync(reinterpret_cast<void*>(range.offset), range.size, MS_SYNC));
    }